

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::internal::
linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
::~linked_ptr(linked_ptr<testing::internal::ParameterizedTestCaseInfo<(anonymous_namespace)::PathTest>::TestInfo>
              *this)

{
  depart(this);
  return;
}

Assistant:

~linked_ptr() { depart(); }